

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall kratos::IRVisitor::visit_root_tp(IRVisitor *this,IRNode *root)

{
  pointer *__alloc;
  pointer __first;
  pointer __last;
  pointer __last_00;
  pointer pfVar1;
  uint32_t uVar2;
  pointer p_Var3;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  pointer __result;
  priority_task *ppVar4;
  thread_pool_error *this_00;
  future<void> *t_1;
  undefined1 this_01 [8];
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined1 local_208 [8];
  GeneratorGraph graph;
  thread_pool pool;
  undefined1 auStack_b8 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> nodes;
  future<void> t;
  __shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [32];
  size_type local_40;
  allocator_type local_31 [8];
  __allocator_type __a2;
  
  if (root->ast_node_type_ != GeneratorKind) {
    (**this->_vptr_IRVisitor)(this);
    return;
  }
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_208,(Generator *)root);
  GeneratorGraph::get_nodes
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
             &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(GeneratorGraph *)local_208);
  uVar2 = get_num_cpus();
  cxxpool::thread_pool::thread_pool((thread_pool *)&graph.root_,(ulong)uVar2);
  auStack_b8 = (undefined1  [8])0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_b8,
             (long)nodes.
                   super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start -
             (long)tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
  p_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    pfVar1 = tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this_01 = auStack_b8;
    if (p_Var5 == (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      for (; this_01 != (undefined1  [8])pfVar1; this_01 = (undefined1  [8])((long)this_01 + 0x10))
      {
        std::future<void>::get((future<void> *)this_01);
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_b8);
      cxxpool::thread_pool::~thread_pool((thread_pool *)&graph.root_);
      std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
                ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_208);
      return;
    }
    t.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)this;
    p_Var3 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(local_31,1);
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_002ad928;
    local_60._0_8_ = local_31;
    local_60._8_8_ = p_Var3;
    std::
    __create_task_state<void(),std::_Bind<kratos::IRVisitor::visit_root_tp(kratos::IRNode*)::__0(kratos::Generator*)>,std::allocator<int>>
              ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_ir_cc:71:13)_(kratos::Generator_*)>
                *)&p_Var3->_M_impl,
               (allocator<int> *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    local_60._8_8_ = (pointer)0x0;
    local_70._M_ptr = (element_type *)&p_Var3->_M_impl;
    local_70._M_refcount._M_pi = &p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_60);
    std::packaged_task<void_()>::get_future
              ((packaged_task<void_()> *)
               &nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::mutex::lock((mutex *)&pool.field_0x80);
    if ((char)graph.root_ == '\x01') break;
    std::__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               &local_70);
    __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
                         ((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                          &pool.tasks_.field_0x18);
    __last = pool.tasks_.c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_40 = std::
                 vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ::_M_check_len((vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                 *)&pool.threads_.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,1,
                                "vector::_M_realloc_insert");
      __last_00 = pool.tasks_.c.
                  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      __first = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      __result = std::
                 _Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ::_M_allocate((_Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                *)&pool.threads_.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,local_40);
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)(((long)__last - (long)__first) + (long)__result),
                 (priority_task *)local_60,
                 (anon_class_16_1_80eb7a8b *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(unsigned_long *)__args_1,in_R8);
      __alloc = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      ppVar4 = std::
               __relocate_a_1<cxxpool::detail::priority_task*,cxxpool::detail::priority_task*,std::allocator<cxxpool::detail::priority_task>>
                         ((priority_task *)__first,__last,__result,
                          (allocator<cxxpool::detail::priority_task> *)__alloc);
      ppVar4 = std::
               __relocate_a_1<cxxpool::detail::priority_task*,cxxpool::detail::priority_task*,std::allocator<cxxpool::detail::priority_task>>
                         (__last,__last_00,ppVar4 + 1,
                          (allocator<cxxpool::detail::priority_task> *)__alloc);
      std::
      _Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ::_M_deallocate((_Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                       *)__alloc,(pointer)__first,
                      (long)pool.tasks_.c.
                            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)__first >> 6);
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_finish = __result + local_40;
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)__result;
    }
    else {
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)
                 pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start,(priority_task *)local_60,
                 (anon_class_16_1_80eb7a8b *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(unsigned_long *)__args_1,in_R8);
      ppVar4 = pool.tasks_.c.
               super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    pool.tasks_.c.
    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar4;
    std::
    push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
              (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,ppVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
    std::condition_variable::notify_one();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)auStack_b8,
               (future<void> *)
               &nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
    p_Var5 = p_Var5 + 1;
  }
  this_00 = (thread_pool_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"push called while pool is shutting down",
             (allocator<char> *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next
            );
  cxxpool::thread_pool_error::thread_pool_error(this_00,(string *)local_60);
  __cxa_throw(this_00,&cxxpool::thread_pool_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IRVisitor::visit_root_tp(kratos::IRNode *root) {
    if (root->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // nothing we can do
        visit_root(root);
        return;
    }
    auto *gen = reinterpret_cast<Generator *>(root);
    GeneratorGraph graph(gen);

    auto nodes = graph.get_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<void>> tasks;
    tasks.reserve(nodes.size());

    for (auto *mod : nodes) {
        auto t = pool.push(
            [this](Generator *g) {
                if (g->external() || g->is_cloned()) return;
                g->accept(this);
                uint64_t count = 0;
                while (count < g->child_count()) {
                    auto *child = g->get_child(count);
                    if (child->ir_node_kind() != IRNodeKind::GeneratorKind) {
                        visit_root_s(child);
                    }
                    if (count < g->child_count() && child == g->get_child(count)) {
                        count++;
                    }
                }
            },
            mod);
        tasks.emplace_back(std::move(t));
    }

    for (auto &t : tasks) {
        t.get();
    }
}